

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  uint uVar1;
  uchar *puVar2;
  reference puVar3;
  byte *pbVar4;
  byte *pbVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  byte in_R9B;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_00000008;
  uint8_t *imageXEnd_1;
  uint8_t *imageX_1;
  iterator data_1;
  uint8_t *imageYEnd_1;
  uint8_t *imageY_1;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  iterator data;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  uint32_t rowSize;
  uint8_t colorCount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int iVar6;
  undefined8 in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  byte *local_70;
  byte *local_68;
  byte *local_60;
  byte *local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  byte *local_48;
  byte *local_40;
  uint32_t local_38;
  undefined4 local_34;
  uint *local_30;
  uint *local_28;
  byte local_1a;
  byte local_19;
  int local_18;
  uint local_14;
  int local_10;
  int local_c;
  ImageTemplate<unsigned_char> *local_8;
  
  local_19 = in_R9B & 1;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,(uint32_t)(in_stack_ffffffffffffff78 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff78,
             (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff70);
  local_1a = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_8);
  iVar6 = local_18;
  if ((local_19 & 1) != 0) {
    iVar6 = local_14 * local_1a;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  local_28 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (in_stack_ffffffffffffff58);
  local_30 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (in_stack_ffffffffffffff58);
  local_34 = 0;
  __last._M_current._4_4_ = iVar6;
  __last._M_current._0_4_ = in_stack_ffffffffffffff68;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
            (in_stack_00000008,__last,
             (uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_38 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_8);
  local_14 = local_14 * local_1a;
  if ((local_19 & 1) == 0) {
    puVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
    local_68 = puVar2 + (ulong)(local_c * (uint)local_1a) + (ulong)(local_10 * local_38);
    local_70 = local_68 + local_18 * local_38;
    local_78._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (in_stack_ffffffffffffff58);
    while (local_68 != local_70) {
      pbVar4 = local_68 + local_14;
      for (pbVar5 = local_68; pbVar5 != pbVar4; pbVar5 = pbVar5 + 1) {
        uVar1 = (uint)*pbVar5;
        puVar3 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_78);
        *puVar3 = uVar1 + *puVar3;
      }
      local_68 = local_68 + local_38;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_78);
    }
  }
  else {
    puVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
    local_40 = puVar2 + (ulong)(local_c * (uint)local_1a) + (ulong)(local_10 * local_38);
    local_48 = local_40 + local_14;
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (in_stack_ffffffffffffff58);
    while (local_40 != local_48) {
      local_60 = local_40 + local_18 * local_38;
      for (local_58 = local_40; local_58 != local_60; local_58 = local_58 + local_38) {
        uVar1 = (uint)*local_58;
        puVar3 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_50);
        *puVar3 = uVar1 + *puVar3;
      }
      local_40 = local_40 + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_50);
    }
  }
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection )
    {
        ParameterValidation( image, x, y, width, height );

        const uint8_t colorCount = image.colorCount();

        projection.resize( horizontal ? width * colorCount : height );
        std::fill( projection.begin(), projection.end(), 0u );

        const uint32_t rowSize = image.rowSize();

        width = width * colorCount;

        if( horizontal ) {
            const uint8_t * imageX = image.data() + y * rowSize + x * colorCount;
            const uint8_t * imageXEnd = imageX + width;

            std::vector < uint32_t > ::iterator data = projection.begin();

            for( ; imageX != imageXEnd; ++imageX, ++data ) {
                const uint8_t * imageY    = imageX;
                const uint8_t * imageYEnd = imageY + height * rowSize;

                for( ; imageY != imageYEnd; imageY += rowSize )
                    (*data) += (*imageY);
            }
        }
        else {
            const uint8_t * imageY = image.data() + y * rowSize + x * colorCount;
            const uint8_t * imageYEnd = imageY + height * rowSize;

            std::vector < uint32_t > ::iterator data = projection.begin();

            for( ; imageY != imageYEnd; imageY += rowSize, ++data ) {
                const uint8_t * imageX    = imageY;
                const uint8_t * imageXEnd = imageX + width;

                for( ; imageX != imageXEnd; ++imageX )
                    (*data) += (*imageX);
            }
        }
    }